

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O0

GTree * g_tree_new(GCompareFunc key_compare_func)

{
  GTree *pGVar1;
  GCompareFunc key_compare_func_local;
  
  pGVar1 = g_tree_new_full((GCompareDataFunc)key_compare_func,(gpointer)0x0,(GDestroyNotify)0x0,
                           (GDestroyNotify)0x0);
  return pGVar1;
}

Assistant:

GTree *g_tree_new (GCompareFunc key_compare_func)
{
    g_return_val_if_fail (key_compare_func != NULL, NULL);

    return g_tree_new_full ((GCompareDataFunc) key_compare_func, NULL,
            NULL, NULL);
}